

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationBuilder::mergeCompositeIntoString
          (CollationBuilder *this,UnicodeString *nfdString,int32_t indexAfterLastStarter,
          UChar32 composite,UnicodeString *decomp,UnicodeString *newNFDString,
          UnicodeString *newString,UErrorCode *errorCode)

{
  UBool UVar1;
  int8_t iVar2;
  int32_t iVar3;
  int iVar4;
  uint srcChar;
  uint uVar5;
  int iVar6;
  UnicodeString *this_00;
  byte local_4a;
  byte local_49;
  UChar32 decompChar;
  uint8_t decompCC;
  int32_t iStack_44;
  uint8_t sourceCC;
  UChar32 sourceChar;
  int32_t decompIndex;
  int32_t sourceIndex;
  int32_t lastStarterLength;
  UnicodeString *newNFDString_local;
  UnicodeString *decomp_local;
  UChar32 composite_local;
  int32_t indexAfterLastStarter_local;
  UnicodeString *nfdString_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iStack_44 = UnicodeString::moveIndex32(decomp,0,1);
    iVar3 = UnicodeString::length(decomp);
    if ((iStack_44 != iVar3) &&
       (iVar2 = UnicodeString::compare
                          (nfdString,indexAfterLastStarter,0x7fffffff,decomp,iStack_44,0x7fffffff),
       iVar2 != '\0')) {
      UnicodeString::setTo(newNFDString,nfdString,0,indexAfterLastStarter);
      this_00 = UnicodeString::setTo(newString,nfdString,0,indexAfterLastStarter - iStack_44);
      UnicodeString::append(this_00,composite);
      decompChar = -1;
      local_49 = 0;
      local_4a = 0;
      sourceChar = indexAfterLastStarter;
      while( true ) {
        if (decompChar < 0) {
          iVar3 = UnicodeString::length(nfdString);
          if (iVar3 <= sourceChar) break;
          decompChar = UnicodeString::char32At(nfdString,sourceChar);
          iVar4 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)(uint)decompChar)
          ;
          local_49 = (byte)iVar4;
        }
        iVar3 = UnicodeString::length(decomp);
        if (iVar3 <= iStack_44) break;
        srcChar = UnicodeString::char32At(decomp,iStack_44);
        uVar5 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)srcChar);
        local_4a = (byte)uVar5;
        if (local_4a == 0) {
          return '\0';
        }
        if (local_49 < local_4a) {
          return '\0';
        }
        if ((uVar5 & 0xff) < (uint)local_49) {
          UnicodeString::append(newNFDString,srcChar);
          iVar4 = 2;
          if (srcChar < 0x10000) {
            iVar4 = 1;
          }
        }
        else {
          if (srcChar != decompChar) {
            return '\0';
          }
          UnicodeString::append(newNFDString,srcChar);
          iVar4 = 2;
          if (srcChar < 0x10000) {
            iVar4 = 1;
          }
          iVar6 = 2;
          if (srcChar < 0x10000) {
            iVar6 = 1;
          }
          sourceChar = iVar6 + sourceChar;
          decompChar = -1;
        }
        iStack_44 = iVar4 + iStack_44;
      }
      if (decompChar < 0) {
        iVar3 = UnicodeString::length(decomp);
        if (iStack_44 < iVar3) {
          UnicodeString::append(newNFDString,decomp,iStack_44,0x7fffffff);
        }
      }
      else {
        if (local_49 < local_4a) {
          return '\0';
        }
        UnicodeString::append(newNFDString,nfdString,sourceChar,0x7fffffff);
        UnicodeString::append(newString,nfdString,sourceChar,0x7fffffff);
      }
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
CollationBuilder::mergeCompositeIntoString(const UnicodeString &nfdString,
                                           int32_t indexAfterLastStarter,
                                           UChar32 composite, const UnicodeString &decomp,
                                           UnicodeString &newNFDString, UnicodeString &newString,
                                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(nfdString.char32At(indexAfterLastStarter - 1) == decomp.char32At(0));
    int32_t lastStarterLength = decomp.moveIndex32(0, 1);
    if(lastStarterLength == decomp.length()) {
        // Singleton decompositions should be found by addWithClosure()
        // and the CanonicalIterator, so we can ignore them here.
        return FALSE;
    }
    if(nfdString.compare(indexAfterLastStarter, 0x7fffffff,
                         decomp, lastStarterLength, 0x7fffffff) == 0) {
        // same strings, nothing new to be found here
        return FALSE;
    }

    // Make new FCD strings that combine a composite, or its decomposition,
    // into the nfdString's last starter and the combining marks following it.
    // Make an NFD version, and a version with the composite.
    newNFDString.setTo(nfdString, 0, indexAfterLastStarter);
    newString.setTo(nfdString, 0, indexAfterLastStarter - lastStarterLength).append(composite);

    // The following is related to discontiguous contraction matching,
    // but builds only FCD strings (or else returns FALSE).
    int32_t sourceIndex = indexAfterLastStarter;
    int32_t decompIndex = lastStarterLength;
    // Small optimization: We keep the source character across loop iterations
    // because we do not always consume it,
    // and then need not fetch it again nor look up its combining class again.
    UChar32 sourceChar = U_SENTINEL;
    // The cc variables need to be declared before the loop so that at the end
    // they are set to the last combining classes seen.
    uint8_t sourceCC = 0;
    uint8_t decompCC = 0;
    for(;;) {
        if(sourceChar < 0) {
            if(sourceIndex >= nfdString.length()) { break; }
            sourceChar = nfdString.char32At(sourceIndex);
            sourceCC = nfd.getCombiningClass(sourceChar);
            U_ASSERT(sourceCC != 0);
        }
        // We consume a decomposition character in each iteration.
        if(decompIndex >= decomp.length()) { break; }
        UChar32 decompChar = decomp.char32At(decompIndex);
        decompCC = nfd.getCombiningClass(decompChar);
        // Compare the two characters and their combining classes.
        if(decompCC == 0) {
            // Unable to merge because the source contains a non-zero combining mark
            // but the composite's decomposition contains another starter.
            // The strings would not be equivalent.
            return FALSE;
        } else if(sourceCC < decompCC) {
            // Composite + sourceChar would not be FCD.
            return FALSE;
        } else if(decompCC < sourceCC) {
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
        } else if(decompChar != sourceChar) {
            // Blocked because same combining class.
            return FALSE;
        } else {  // match: decompChar == sourceChar
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
            sourceIndex += U16_LENGTH(decompChar);
            sourceChar = U_SENTINEL;
        }
    }
    // We are at the end of at least one of the two inputs.
    if(sourceChar >= 0) {  // more characters from nfdString but not from decomp
        if(sourceCC < decompCC) {
            // Appending the next source character to the composite would not be FCD.
            return FALSE;
        }
        newNFDString.append(nfdString, sourceIndex, 0x7fffffff);
        newString.append(nfdString, sourceIndex, 0x7fffffff);
    } else if(decompIndex < decomp.length()) {  // more characters from decomp, not from nfdString
        newNFDString.append(decomp, decompIndex, 0x7fffffff);
    }
    U_ASSERT(nfd.isNormalized(newNFDString, errorCode));
    U_ASSERT(fcd.isNormalized(newString, errorCode));
    U_ASSERT(nfd.normalize(newString, errorCode) == newNFDString);  // canonically equivalent
    return TRUE;
}